

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

bool __thiscall
TestTransaction::GetVariableIntTest(TestTransaction *this,string *test_data,uint64_t *value)

{
  bool bVar1;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test_array;
  size_t local_30;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  cfd::core::StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,(string *)test_data)
  ;
  local_30 = 0;
  bVar1 = cfd::core::AbstractTransaction::GetVariableInt
                    (local_28._M_impl.super__Vector_impl_data._M_start,
                     (long)local_28._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_28._M_impl.super__Vector_impl_data._M_start,value,&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return bVar1;
}

Assistant:

bool GetVariableIntTest(const std::string &test_data, uint64_t *value) {
    bool is_success = false;
    std::vector<uint8_t> test_array = StringUtil::StringToByte(test_data);
    size_t size = 0;
    is_success = GetVariableInt(test_array.data(), test_array.size(),
                                value, &size);
    return is_success;
  }